

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzquadrilateral.cpp
# Opt level: O0

void pztopology::TPZQuadrilateral::ParametricDomainNodeCoord(int node,TPZVec<double> *nodeCoord)

{
  double *pdVar1;
  TPZVec<double> *in_RSI;
  int in_EDI;
  size_t in_stack_000003f8;
  char *in_stack_00000400;
  undefined8 local_18;
  TPZVec<double> *local_10;
  int local_4;
  
  local_10 = in_RSI;
  local_4 = in_EDI;
  if (4 < in_EDI) {
    pzinternal::DebugStopImpl(in_stack_00000400,in_stack_000003f8);
  }
  local_18 = 0;
  (*local_10->_vptr_TPZVec[2])(local_10,2,&local_18);
  switch(local_4) {
  case 0:
    pdVar1 = TPZVec<double>::operator[](local_10,0);
    *pdVar1 = -1.0;
    pdVar1 = TPZVec<double>::operator[](local_10,1);
    *pdVar1 = -1.0;
    break;
  case 1:
    pdVar1 = TPZVec<double>::operator[](local_10,0);
    *pdVar1 = 1.0;
    pdVar1 = TPZVec<double>::operator[](local_10,1);
    *pdVar1 = -1.0;
    break;
  case 2:
    pdVar1 = TPZVec<double>::operator[](local_10,0);
    *pdVar1 = 1.0;
    pdVar1 = TPZVec<double>::operator[](local_10,1);
    *pdVar1 = 1.0;
    break;
  case 3:
    pdVar1 = TPZVec<double>::operator[](local_10,0);
    *pdVar1 = -1.0;
    pdVar1 = TPZVec<double>::operator[](local_10,1);
    *pdVar1 = 1.0;
    break;
  default:
    pzinternal::DebugStopImpl(in_stack_00000400,in_stack_000003f8);
  }
  return;
}

Assistant:

void TPZQuadrilateral::ParametricDomainNodeCoord(int node, TPZVec<REAL> &nodeCoord)
    {
        if(node > NCornerNodes)
        {
            DebugStop();
        }
        nodeCoord.Resize(Dimension, 0.);
        switch (node) {
            case (0):
            {
                nodeCoord[0] = -1.;
                nodeCoord[1] = -1.;
                break;
            }
            case (1):
            {
                nodeCoord[0] =  1.;
                nodeCoord[1] = -1.;
                break;
            }
            case (2):
            {
                nodeCoord[0] = 1.;
                nodeCoord[1] = 1.;
                break;
            }
            case (3):
            {
                nodeCoord[0] = -1.;
                nodeCoord[1] =  1.;
                break;
            }
            default:
            {
                DebugStop();
                break;
            }
        }
    }